

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llnl_cv1_tsd.c
# Opt level: O2

void * inc_count(void *t)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = *t;
  for (uVar4 = 0; uVar4 != 10; uVar4 = uVar4 + 1) {
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)t + 8) + 8));
    puVar2 = *(uint **)((long)t + 8);
    uVar3 = *puVar2 + 1;
    *puVar2 = uVar3;
    if (uVar3 == 0xc) {
      pthread_cond_signal((pthread_cond_t *)(puVar2 + 0xc));
      printf("inc_count(): thread %ld, count = %d  Threshold reached.\n",(long)iVar1,
             (ulong)**(uint **)((long)t + 8));
      uVar3 = **(uint **)((long)t + 8);
    }
    printf("inc_count(): thread %ld, count = %d, i = %d, unlocking mutex\n",(long)iVar1,(ulong)uVar3
           ,(ulong)uVar4);
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)t + 8) + 8));
    sleep(1);
  }
  pthread_exit((void *)0x0);
}

Assistant:

void *inc_count(void *t)
{
    tsd_t* tsd = (tsd_t*) t;
    long my_id = tsd->my_id;
    int i;

    for (i=0; i<TCOUNT; i++)
    {
        pthread_mutex_lock(&tsd->common->count_mutex);
        tsd->common->count++;

        /*
        Check the value of count and signal waiting thread when condition is
        reached.  Note that this occurs while mutex is locked.
        */
        if (tsd->common->count == COUNT_LIMIT)
        {
            pthread_cond_signal(&tsd->common->count_threshold_cv);
            printf("inc_count(): thread %ld, count = %d  Threshold reached.\n",
                   my_id, tsd->common->count);
        }
        printf("inc_count(): thread %ld, count = %d, i = %d, unlocking mutex\n",
               my_id, tsd->common->count, i);
        pthread_mutex_unlock(&tsd->common->count_mutex);

        /* Do some "work" so threads can alternate on mutex lock */
        sleep(1);
    }
    pthread_exit(NULL);
}